

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ring_buffer_on_shmem.cpp
# Opt level: O2

bool __thiscall
SharedMemRingBuffer::InitIndexBuffer(SharedMemRingBuffer *this,key_t key_index_buffer,size_t size)

{
  _func_int **pp_Var1;
  bool bVar2;
  ulong in_RAX;
  StatusOnSharedMem *pSVar3;
  WaitStrategyInterface *pWVar4;
  size_t sVar5;
  ulong uVar6;
  ulong uStack_28;
  bool bSharedMemFirstCreated;
  
  if (size == 0) {
    return false;
  }
  this->buffer_size_ = size;
  uStack_28 = in_RAX;
  bVar2 = RingBuffer<_PositionInfo__*>::SetCapacity(&this->ring_buffer_,size);
  if (bVar2) {
    sVar5 = size * 0x20 + 0x780;
    this->total_mem_size_ = sVar5;
    uStack_28 = uStack_28 & 0xffffffffffffff;
    bVar2 = SharedMemoryManager::CreateShMem
                      (&this->shared_index_buffer_,key_index_buffer,sVar5,&bSharedMemFirstCreated);
    if ((bVar2) && (bVar2 = SharedMemoryManager::AttachShMem(&this->shared_index_buffer_), bVar2)) {
      pSVar3 = (StatusOnSharedMem *)(this->shared_index_buffer_).sh_mem_start_addr_;
      this->ring_buffer_status_on_shared_mem_ = pSVar3;
      if (bSharedMemFirstCreated == true) {
        ResetRingBufferState(this);
        pSVar3 = (StatusOnSharedMem *)(this->shared_index_buffer_).sh_mem_start_addr_;
      }
      pSVar3 = pSVar3 + 1;
      sVar5 = (this->ring_buffer_).capacity_;
      for (uVar6 = 0; size != uVar6; uVar6 = uVar6 + 1) {
        (this->ring_buffer_).buffer_.
        super__Vector_base<_PositionInfo__*,_std::allocator<_PositionInfo__*>_>._M_impl.
        super__Vector_impl_data._M_start[sVar5 - 1 & uVar6] = (_PositionInfo_ *)pSVar3;
        pSVar3 = (StatusOnSharedMem *)&pSVar3->field_0x20;
      }
      pSVar3 = this->ring_buffer_status_on_shared_mem_;
      pSVar3->nBufferSize = (int)size;
      pSVar3->nTotalMemSize = (int)this->total_mem_size_;
      if ((ulong)this->wait_strategy_type_ < 3) {
        pp_Var1 = (_func_int **)(&PTR_PTR_00108d98)[this->wait_strategy_type_];
        pWVar4 = (WaitStrategyInterface *)operator_new(0x10);
        pWVar4->_vptr_WaitStrategyInterface = pp_Var1;
        pWVar4->status_on_shared_mem_ = pSVar3;
        this->wait_strategy_ = pWVar4;
        return true;
      }
    }
  }
  return false;
}

Assistant:

bool SharedMemRingBuffer::InitIndexBuffer(key_t key_index_buffer, size_t size )
{
    if(size == 0) {
        DEBUG_ELOG("Error: Invalid size : " << size); 
        return false;
    }
    buffer_size_ = size;

    if(!ring_buffer_.SetCapacity(size) ) {
        DEBUG_ELOG("Error: Invalid size : " << size); 
        return false;
    }
    //shared memory consists of : StatusOnSharedMem + actual data
    total_mem_size_ = sizeof(_StatusOnSharedMem_)  + (sizeof(PositionInfo) * size) ;

    bool bSharedMemFirstCreated = false;
    if(! shared_index_buffer_.CreateShMem(key_index_buffer, total_mem_size_, &bSharedMemFirstCreated )) {
        DEBUG_ELOG("Error: shared memory failed "); 
        return false;
    }
    if(! shared_index_buffer_.AttachShMem()) {
        DEBUG_ELOG("Error: shared memory failed "); 
        return false;
    }

    ring_buffer_status_on_shared_mem_ = (StatusOnSharedMem*) shared_index_buffer_. GetShMemStartAddr(); 
    if(bSharedMemFirstCreated) {
        ResetRingBufferState();
    }
    char* buffer_start = (char*)shared_index_buffer_.GetShMemStartAddr() + sizeof(_StatusOnSharedMem_) ; 

    for(size_t i = 0; i < size; i++) {
        ring_buffer_[i] = (PositionInfo*) ( (char*)buffer_start + (sizeof(PositionInfo)*i) ) ;
    }

    ring_buffer_status_on_shared_mem_->nBufferSize = size;
    ring_buffer_status_on_shared_mem_->nTotalMemSize = total_mem_size_;

    //---------------------------------------------
    //wait strategy
    if(wait_strategy_type_ == BLOCKING_WAIT ) {
        DEBUG_LOG ("Wait Strategy :BLOCKING_WAIT" ); 
        wait_strategy_ = new BlockingWaitStrategy(ring_buffer_status_on_shared_mem_);
    } else if(wait_strategy_type_ == YIELDING_WAIT ) {
        DEBUG_LOG( "Wait Strategy :YIELDING_WAIT" ); 
        wait_strategy_ = new YieldingWaitStrategy(ring_buffer_status_on_shared_mem_);
    } else if(wait_strategy_type_ == SLEEPING_WAIT ) {
        DEBUG_LOG( "Wait Strategy :SLEEPING_WAIT" ); 
        wait_strategy_ = new SleepingWaitStrategy(ring_buffer_status_on_shared_mem_);
    } else {
        DEBUG_ELOG( "Invalid Wait Strategy :" << wait_strategy_type_); 
        return false;
    }
    return true;
}